

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexPlaneCollisionAlgorithm.cpp
# Opt level: O2

btScalar __thiscall
btConvexPlaneCollisionAlgorithm::calculateTimeOfImpact
          (btConvexPlaneCollisionAlgorithm *this,btCollisionObject *col0,btCollisionObject *col1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  return 1.0;
}

Assistant:

btScalar btConvexPlaneCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* col0,btCollisionObject* col1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	(void)col0;
	(void)col1;

	//not yet
	return btScalar(1.);
}